

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaCom.c
# Opt level: O3

int Cba_CommandBlast(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Cba_Man_t *p;
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint fVerbose;
  uint fSeq;
  char *pcVar3;
  
  p = (Cba_Man_t *)pAbc->pAbcCba;
  fSeq = 0;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"svh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x73) {
      Abc_Print(-2,"usage: :blast [-svh]\n");
      Abc_Print(-2,"\t         performs bit-blasting of the word-level design\n");
      pcVar3 = "yes";
      pcVar2 = "yes";
      if (fSeq == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle blasting sequential elements [default = %s]\n",pcVar2);
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
    fSeq = fSeq ^ 1;
  }
  if (p == (Cba_Man_t *)0x0) {
    pcVar2 = "Cba_CommandBlast(): There is no current design.\n";
  }
  else {
    pNew = Cba_ManBlast(p,0,fSeq,fVerbose);
    if (pNew != (Gia_Man_t *)0x0) {
      Abc_FrameUpdateGia(pAbc,pNew);
      return 0;
    }
    pcVar2 = "Cba_CommandBlast(): Bit-blasting has failed.\n";
  }
  Abc_Print(1,pcVar2);
  return 0;
}

Assistant:

int Cba_CommandBlast( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pNew = NULL;
    Cba_Man_t * p = Cba_AbcGetMan(pAbc);
    int c, fSeq = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "svh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fSeq ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Cba_CommandBlast(): There is no current design.\n" );
        return 0;
    }
    pNew = Cba_ManBlast( p, 0, fSeq, fVerbose );
    if ( pNew == NULL )
    {
        Abc_Print( 1, "Cba_CommandBlast(): Bit-blasting has failed.\n" );
        return 0;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;
usage:
    Abc_Print( -2, "usage: :blast [-svh]\n" );
    Abc_Print( -2, "\t         performs bit-blasting of the word-level design\n" );
    Abc_Print( -2, "\t-s     : toggle blasting sequential elements [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}